

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(EpsCopyOutputStream *this,uint8 *ptr)

{
  uint8 *__src;
  uint8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  int size;
  uint local_3c;
  uint8 *local_38;
  
  __src = this->buffer_;
  do {
    if (this->had_error_ != false) {
      return __src;
    }
    puVar1 = this->end_;
    puVar5 = this->buffer_ + 0x10;
    if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
LAB_001a0763:
      this->had_error_ = true;
LAB_001a0749:
      this->end_ = puVar5;
      puVar4 = __src;
    }
    else {
      if (this->buffer_end_ == (uint8 *)0x0) {
        uVar2 = *(undefined8 *)(puVar1 + 8);
        *(undefined8 *)__src = *(undefined8 *)puVar1;
        *(undefined8 *)(this->buffer_ + 8) = uVar2;
        this->buffer_end_ = puVar1;
        goto LAB_001a0749;
      }
      memcpy(this->buffer_end_,__src,(long)puVar1 - (long)__src);
      do {
        iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_38,&local_3c);
        if ((char)iVar3 == '\0') goto LAB_001a0763;
      } while ((ulong)local_3c == 0);
      puVar5 = this->end_;
      if ((int)local_3c < 0x11) {
        uVar2 = *(undefined8 *)(puVar5 + 8);
        *(undefined8 *)__src = *(undefined8 *)puVar5;
        *(undefined8 *)(this->buffer_ + 8) = uVar2;
        this->buffer_end_ = local_38;
        puVar5 = __src + (int)local_3c;
        goto LAB_001a0749;
      }
      uVar2 = *(undefined8 *)(puVar5 + 8);
      *(undefined8 *)local_38 = *(undefined8 *)puVar5;
      *(undefined8 *)(local_38 + 8) = uVar2;
      puVar5 = local_38 + ((ulong)local_3c - 0x10);
      this->end_ = puVar5;
      this->buffer_end_ = (uint8 *)0x0;
      puVar4 = local_38;
    }
    ptr = puVar4 + ((int)ptr - (int)puVar1);
    if (ptr < puVar5) {
      return ptr;
    }
  } while( true );
}

Assistant:

uint8* EpsCopyOutputStream::EnsureSpaceFallback(uint8* ptr) {
  do {
    if (PROTOBUF_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    GOOGLE_DCHECK(overrun >= 0);           // NOLINT
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  GOOGLE_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}